

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O3

MessageTemplate * __thiscall
ki::protocol::dml::MessageModule::get_message_template(MessageModule *this,uint8_t type)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppMVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  key_type local_1;
  
  p_Var3 = (this->m_message_type_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_message_type_map)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      bVar5 = (byte)(char)p_Var3[1]._M_color < type;
      if (!bVar5) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar5];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && ((byte)(char)p_Var4[1]._M_color <= type)) {
      ppMVar2 = std::
                map<unsigned_char,_ki::protocol::dml::MessageTemplate_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageTemplate_*>_>_>
                ::at(&this->m_message_type_map,&local_1);
      return *ppMVar2;
    }
  }
  return (MessageTemplate *)0x0;
}

Assistant:

const MessageTemplate *MessageModule::get_message_template(uint8_t type) const
	{
		if (m_message_type_map.count(type) == 1)
			return m_message_type_map.at(type);
		return nullptr;
	}